

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOfPlaceHolder
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QString *objectName)

{
  QDockAreaLayoutItem *pQVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->item_list).d.size != 0) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      pQVar1 = (this->item_list).d.ptr;
      if (*(long *)((long)&pQVar1->widgetItem + lVar7) == 0) {
        lVar3 = *(long *)((long)&pQVar1->subinfo + lVar7);
        if (((lVar3 != 0) && (lVar4 = *(long *)(lVar3 + 0x10), lVar4 == (objectName->d).size)) &&
           (QVar8.m_data = *(storage_type_conflict **)(lVar3 + 8), QVar8.m_size = lVar4,
           QVar9.m_data = (objectName->d).ptr, QVar9.m_size = lVar4,
           cVar5 = QtPrivate::equalStrings(QVar8,QVar9), cVar5 != '\0')) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (int *)0x0;
          (__return_storage_ptr__->d).size = 0;
          local_3c = (int)uVar6;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
          QList<int>::end(__return_storage_ptr__);
          goto LAB_003f1f8a;
        }
      }
      else {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        indexOfPlaceHolder(__return_storage_ptr__,
                           *(QDockAreaLayoutInfo **)((long)&pQVar1->widgetItem + lVar7),objectName);
        if ((__return_storage_ptr__->d).size != 0) {
          local_3c = (int)uVar6;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
LAB_003f1f8a:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return __return_storage_ptr__;
          }
          goto LAB_003f1fd6;
        }
        pDVar2 = (__return_storage_ptr__->d).d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
          }
        }
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x28;
    } while (uVar6 < (ulong)(this->item_list).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_003f1fd6:
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOfPlaceHolder(objectName);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (item.placeHolderItem != nullptr && item.placeHolderItem->objectName == objectName) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}